

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O1

void __thiscall
QGraphicsSceneIndexPrivate::recursive_items_helper
          (QGraphicsSceneIndexPrivate *this,QGraphicsItem *item,QRectF exposeRect,
          QGraphicsSceneIndexIntersector intersect,QList<QGraphicsItem_*> *items,
          QTransform *viewTransform,ItemSelectionMode mode,qreal parentOpacity,void *intersectData)

{
  undefined1 *puVar1;
  long lVar2;
  QGraphicsItem **ppQVar3;
  ulong uVar4;
  QGraphicsItem *pQVar5;
  QRectF exposeRect_00;
  QRectF exposeRect_01;
  QGraphicsItemPrivate *pQVar6;
  ulong uVar7;
  QPainterPath *this_00;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  qreal parentOpacity_00;
  QPainterPath mappedShape;
  bool local_ca;
  QPainterPath local_70 [8];
  QPainterPath local_68 [8];
  undefined1 *local_60;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = (item->d_ptr).d;
  uVar8 = *(ulong *)&pQVar6->field_0x160;
  if ((uVar8 & 0x20) == 0) goto LAB_006370a4;
  if ((((uint)(uVar8 >> 0x26) & 1) == 0 && pQVar6->parent != (QGraphicsItem *)0x0) &&
     ((((pQVar6->parent->d_ptr).d)->field_0x164 & 0x80) == 0)) {
    parentOpacity_00 = parentOpacity * pQVar6->opacity;
  }
  else {
    parentOpacity_00 = pQVar6->opacity;
  }
  lVar2 = (pQVar6->children).d.size;
  if (parentOpacity_00 < 0.001) {
    if ((lVar2 == 0) || (uVar9 = (pQVar6->children).d.size, uVar9 == 0)) goto LAB_006370a4;
    if (((uVar8 >> 0x27 & 1) == 0) &&
       (ppQVar3 = (pQVar6->children).d.ptr,
       (*(ulong *)&(((*ppQVar3)->d_ptr).d)->field_0x160 & 0x4000000000) == 0)) {
      uVar4 = 1;
      do {
        uVar7 = uVar4;
        if (uVar9 == uVar7) break;
        uVar4 = uVar7 + 1;
      } while ((*(ulong *)&((ppQVar3[uVar7]->d_ptr).d)->field_0x160 & 0x4000000000) == 0);
      if (uVar9 <= uVar7) goto LAB_006370a4;
    }
  }
  uVar9 = uVar8 & 0x20002000040000;
  if (uVar9 == 0x20000000000000) {
    (*pQVar6->_vptr_QGraphicsItemPrivate[2])();
  }
  local_ca = 0.001 <= parentOpacity_00;
  uVar4 = *(ulong *)&((item->d_ptr).d)->field_0x160;
  if (0.001 <= parentOpacity_00) {
    local_ca = (*intersect)(item,&exposeRect,mode,viewTransform,intersectData);
    if ((!local_ca) && (lVar2 == 0 || (uVar4 & 0x8001000000000) != 0)) {
      if ((uVar9 == 0x20000000000000) && (pQVar6 = (item->d_ptr).d, (pQVar6->children).d.size != 0))
      {
        uVar8 = 0;
        do {
          puVar1 = &(((pQVar6->children).d.ptr[uVar8]->d_ptr).d)->field_0x160;
          *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(pQVar6->children).d.size);
      }
      goto LAB_006370a4;
    }
  }
  if (lVar2 == 0) {
LAB_00636fbf:
    uVar8 = 0;
  }
  else {
    QGraphicsItemPrivate::ensureSortedChildren((item->d_ptr).d);
    if (((uVar8 & 0x2000040000) == 0) && ((uVar4 & 0x8001000000000) != 0)) {
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      uVar8 = *(ulong *)&((item->d_ptr).d)->field_0x160;
      if ((uVar8 >> 0x3e & 1) == 0) {
        (*item->_vptr_QGraphicsItem[4])(local_70,item);
        QTransform::map((QPainterPath *)&local_60);
      }
      else {
        (*item->_vptr_QGraphicsItem[4])(local_68,item);
        pQVar6 = (item->d_ptr).d;
        QPainterPath::translated
                  ((pQVar6->sceneTransform).m_matrix[2][0],(pQVar6->sceneTransform).m_matrix[2][1]);
      }
      if ((uVar8 >> 0x3e & 1) == 0) {
        this_00 = local_70;
      }
      else {
        this_00 = local_68;
      }
      QPainterPath::~QPainterPath(this_00);
      QPainterPath::controlPointRect();
      QRectF::operator&(&local_58,&exposeRect);
      exposeRect.w = local_58.w;
      exposeRect.h = local_58.h;
      exposeRect.xp = local_58.xp;
      exposeRect.yp = local_58.yp;
      QPainterPath::~QPainterPath((QPainterPath *)&local_60);
    }
    pQVar6 = (item->d_ptr).d;
    if ((pQVar6->children).d.size == 0) goto LAB_00636fbf;
    uVar8 = 0;
    do {
      pQVar5 = (pQVar6->children).d.ptr[uVar8];
      if (uVar9 == 0x20000000000000) {
        puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
      }
      uVar4 = *(ulong *)&((pQVar5->d_ptr).d)->field_0x160;
      if ((uVar4 >> 0x28 & 1) == 0) break;
      if ((0.001 <= parentOpacity_00) || ((uVar4 & 0x4000000000) != 0)) {
        exposeRect_00.yp = exposeRect.yp;
        exposeRect_00.xp = exposeRect.xp;
        exposeRect_00.w = exposeRect.w;
        exposeRect_00.h = exposeRect.h;
        recursive_items_helper
                  (this,pQVar5,exposeRect_00,intersect,items,viewTransform,mode,parentOpacity_00,
                   intersectData);
      }
      if ((uVar4 >> 0x28 & 1) == 0) break;
      uVar8 = uVar8 + 1;
      pQVar6 = (item->d_ptr).d;
    } while (uVar8 < (ulong)(pQVar6->children).d.size);
    uVar8 = uVar8 & 0xffffffff;
  }
  if (local_ca != false) {
    local_58.xp = (qreal)item;
    QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
              ((QPodArrayOps<QGraphicsItem*> *)items,(items->d).size,(QGraphicsItem **)&local_58);
    QList<QGraphicsItem_*>::end(items);
  }
  if (lVar2 != 0) {
    for (; pQVar6 = (item->d_ptr).d, uVar8 < (ulong)(pQVar6->children).d.size; uVar8 = uVar8 + 1) {
      pQVar5 = (pQVar6->children).d.ptr[uVar8];
      if (uVar9 == 0x20000000000000) {
        puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
      }
      if ((0.001 <= parentOpacity_00) ||
         ((*(ulong *)&((pQVar5->d_ptr).d)->field_0x160 & 0x4000000000) != 0)) {
        exposeRect_01.yp = exposeRect.yp;
        exposeRect_01.xp = exposeRect.xp;
        exposeRect_01.w = exposeRect.w;
        exposeRect_01.h = exposeRect.h;
        recursive_items_helper
                  (this,pQVar5,exposeRect_01,intersect,items,viewTransform,mode,parentOpacity_00,
                   intersectData);
      }
    }
  }
LAB_006370a4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsSceneIndexPrivate::recursive_items_helper(QGraphicsItem *item, QRectF exposeRect,
                                                        QGraphicsSceneIndexIntersector intersect,
                                                        QList<QGraphicsItem *> *items,
                                                        const QTransform &viewTransform,
                                                        Qt::ItemSelectionMode mode,
                                                        qreal parentOpacity, const void *intersectData) const
{
    Q_ASSERT(item);
    if (!item->d_ptr->visible)
        return;

    const qreal opacity = item->d_ptr->combineOpacityFromParent(parentOpacity);
    const bool itemIsFullyTransparent = QGraphicsItemPrivate::isOpacityNull(opacity);
    const bool itemHasChildren = !item->d_ptr->children.isEmpty();
    if (itemIsFullyTransparent && (!itemHasChildren || item->d_ptr->childrenCombineOpacity()))
        return;

    // Update the item's scene transform if dirty.
    const bool itemIsUntransformable = item->d_ptr->itemIsUntransformable();
    const bool wasDirtyParentSceneTransform = item->d_ptr->dirtySceneTransform && !itemIsUntransformable;
    if (wasDirtyParentSceneTransform) {
        item->d_ptr->updateSceneTransformFromParent();
        Q_ASSERT(!item->d_ptr->dirtySceneTransform);
    }

    const bool itemClipsChildrenToShape = (item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                                           || item->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape);
    bool processItem = !itemIsFullyTransparent;
    if (processItem) {
        processItem = intersect(item, exposeRect, mode, viewTransform, intersectData);
        if (!processItem && (!itemHasChildren || itemClipsChildrenToShape)) {
            if (wasDirtyParentSceneTransform)
                item->d_ptr->invalidateChildrenSceneTransform();
            return;
        }
    } // else we know for sure this item has children we must process.

    int i = 0;
    if (itemHasChildren) {
        // Sort children.
        item->d_ptr->ensureSortedChildren();

        // Clip to shape.
        if (itemClipsChildrenToShape && !itemIsUntransformable) {
            QPainterPath mappedShape = item->d_ptr->sceneTransformTranslateOnly
                                     ? item->shape().translated(item->d_ptr->sceneTransform.dx(),
                                                                item->d_ptr->sceneTransform.dy())
                                     : item->d_ptr->sceneTransform.map(item->shape());
            exposeRect &= mappedShape.controlPointRect();
        }

        // Process children behind
        for (i = 0; i < item->d_ptr->children.size(); ++i) {
            QGraphicsItem *child = item->d_ptr->children.at(i);
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (!(child->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent))
                break;
            if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                continue;
            recursive_items_helper(child, exposeRect, intersect, items, viewTransform,
                                   mode, opacity, intersectData);
        }
    }

    // Process item
    if (processItem)
        items->append(item);

    // Process children in front
    if (itemHasChildren) {
        for (; i < item->d_ptr->children.size(); ++i) {
            QGraphicsItem *child = item->d_ptr->children.at(i);
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                continue;
            recursive_items_helper(child, exposeRect, intersect, items, viewTransform,
                                   mode, opacity, intersectData);
        }
    }
}